

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_map.c
# Opt level: O0

int nghttp2_map_each(nghttp2_map *map,_func_int_void_ptr_void_ptr *func,void *ptr)

{
  int iVar1;
  nghttp2_map_bucket *bkt;
  uint32_t i;
  int rv;
  void *ptr_local;
  _func_int_void_ptr_void_ptr *func_local;
  nghttp2_map *map_local;
  
  bkt._0_4_ = 0;
  while( true ) {
    if (map->tablelen <= (uint)bkt) {
      return 0;
    }
    if ((map->table[(uint)bkt].data != (void *)0x0) &&
       (iVar1 = (*func)(map->table[(uint)bkt].data,ptr), iVar1 != 0)) break;
    bkt._0_4_ = (uint)bkt + 1;
  }
  return iVar1;
}

Assistant:

int nghttp2_map_each(nghttp2_map *map, int (*func)(void *data, void *ptr),
                     void *ptr) {
  int rv;
  uint32_t i;
  nghttp2_map_bucket *bkt;

  for (i = 0; i < map->tablelen; ++i) {
    bkt = &map->table[i];

    if (bkt->data == NULL) {
      continue;
    }

    rv = func(bkt->data, ptr);
    if (rv != 0) {
      return rv;
    }
  }

  return 0;
}